

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O1

void __thiscall
pbrt::ExhaustiveLightSampler::ExhaustiveLightSampler
          (ExhaustiveLightSampler *this,span<const_pbrt::LightHandle> lights,Allocator alloc)

{
  size_t sVar1;
  long lVar2;
  LightHandle *first;
  vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_> *this_00;
  optional<pbrt::LightBounds> lb;
  size_t local_70;
  aligned_storage_t<sizeof(pbrt::LightBounds),_alignof(pbrt::LightBounds)> local_68;
  char local_34;
  
  sVar1 = lights.n;
  first = lights.ptr;
  local_68._0_8_ = alloc.memoryResource;
  pstd::vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>>::
  vector<pbrt::LightHandle_const*>
            ((vector<pbrt::LightHandle,pstd::pmr::polymorphic_allocator<pbrt::LightHandle>> *)this,
             first,first + sVar1,(polymorphic_allocator<pbrt::LightHandle> *)&local_68.__align);
  (this->boundedLights).alloc.memoryResource = alloc.memoryResource;
  (this->boundedLights).ptr = (LightHandle *)0x0;
  (this->boundedLights).nAlloc = 0;
  (this->boundedLights).nStored = 0;
  (this->infiniteLights).alloc.memoryResource = alloc.memoryResource;
  (this->infiniteLights).ptr = (LightHandle *)0x0;
  (this->infiniteLights).nAlloc = 0;
  (this->infiniteLights).nStored = 0;
  (this->lightBounds).alloc.memoryResource = alloc.memoryResource;
  (this->lightBounds).ptr = (LightBounds *)0x0;
  (this->lightBounds).nAlloc = 0;
  (this->lightBounds).nStored = 0;
  local_68._0_8_ = alloc.memoryResource;
  pstd::
  vector<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
  ::vector(&(this->lightToBoundedIndex).table,8,
           (polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_> *)
           &local_68.__align);
  (this->lightToBoundedIndex).nStored = 0;
  if (sVar1 != 0) {
    lVar2 = sVar1 << 3;
    do {
      LightHandle::Bounds((optional<pbrt::LightBounds> *)&local_68.__align,first);
      this_00 = &this->infiniteLights;
      if (local_34 == '\x01') {
        local_70 = (this->boundedLights).nStored;
        HashMap<pbrt::LightHandle,_unsigned_long,_pbrt::LightHandleHash,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::LightHandle,_unsigned_long>_>_>_>
        ::Insert(&this->lightToBoundedIndex,first,&local_70);
        if (local_34 == '\0') {
          LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x58017c);
        }
        pstd::vector<pbrt::LightBounds,_pstd::pmr::polymorphic_allocator<pbrt::LightBounds>_>::
        push_back(&this->lightBounds,(LightBounds *)&local_68.__align);
        this_00 = &this->boundedLights;
      }
      pstd::vector<pbrt::LightHandle,_pstd::pmr::polymorphic_allocator<pbrt::LightHandle>_>::
      push_back(this_00,first);
      if (local_34 == '\x01') {
        local_34 = '\0';
      }
      first = first + 1;
      lVar2 = lVar2 + -8;
    } while (lVar2 != 0);
  }
  return;
}

Assistant:

ExhaustiveLightSampler::ExhaustiveLightSampler(pstd::span<const LightHandle> lights,
                                               Allocator alloc)
    : lights(lights.begin(), lights.end(), alloc),
      boundedLights(alloc),
      infiniteLights(alloc),
      lightBounds(alloc),
      lightToBoundedIndex(alloc) {
    for (const auto &light : lights) {
        if (pstd::optional<LightBounds> lb = light.Bounds(); lb) {
            lightToBoundedIndex.Insert(light, boundedLights.size());
            lightBounds.push_back(*lb);
            boundedLights.push_back(light);
        } else
            infiniteLights.push_back(light);
    }
}